

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O3

size_t license::mstrlcpy(char *dst,char *src,size_t n)

{
  size_t sVar1;
  size_t n_orig;
  
  sVar1 = n;
  if (n == 0) {
    sVar1 = 0;
  }
  else {
    while (sVar1 = sVar1 - 1, sVar1 != 0) {
      if (*src == '\0') goto LAB_00128172;
      *dst = *src;
      dst = dst + 1;
      src = src + 1;
    }
    sVar1 = 0;
LAB_00128172:
    *dst = '\0';
  }
  return n - sVar1;
}

Assistant:

size_t mstrlcpy(char *dst, const char *src, size_t n) {
	size_t n_orig = n;
	if (n > 0) {
		char *pd;
		const char *ps;

		for (--n, pd = dst, ps = src; n > 0 && *ps != '\0'; --n, ++pd, ++ps) *pd = *ps;

		*pd = '\0';
	}

	return n_orig - n;
}